

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTable>::Clear(ImPool<ImGuiTable> *this)

{
  ImGuiStoragePair *pIVar1;
  ImVector<ImGuiTable> *in_RDI;
  int idx;
  int n;
  int in_stack_fffffffffffffff0;
  int i;
  
  for (i = 0; i < in_RDI[1].Size; i = i + 1) {
    pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)(in_RDI + 1),i);
    in_stack_fffffffffffffff0 = (pIVar1->field_1).val_i;
    if (in_stack_fffffffffffffff0 != -1) {
      ImVector<ImGuiTable>::operator[](in_RDI,in_stack_fffffffffffffff0);
      ImGuiTable::~ImGuiTable((ImGuiTable *)CONCAT44(i,in_stack_fffffffffffffff0));
    }
  }
  ImGuiStorage::Clear((ImGuiStorage *)0x150607);
  ImVector<ImGuiTable>::clear((ImVector<ImGuiTable> *)CONCAT44(i,in_stack_fffffffffffffff0));
  in_RDI[2].Size = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = 0; }